

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

IdentPtr __thiscall
HashTbl::FindExistingPid<unsigned_char>
          (HashTbl *this,uchar *prgch,uchar *end,int32 cch,uint32 luHash,IdentPtr **pppInsert,
          int32 *pBucketCount,int *depth)

{
  IdentPtr pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  IdentPtr pIVar5;
  
  uVar3 = this->m_luMask & luHash;
  pIVar1 = this->m_prgpidName[uVar3];
  if (pIVar1 == (IdentPtr)0x0) {
    pIVar5 = (IdentPtr)(this->m_prgpidName + uVar3);
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      pIVar5 = pIVar1;
      if (((pIVar5->m_luHash == luHash) && (pIVar5->m_cch == cch)) &&
         (bVar2 = utf8::CharsAreEqual((LPCOLESTR)&pIVar5->field_0x22,prgch,end,
                                      doAllowThreeByteSurrogates), bVar2)) {
        return pIVar5;
      }
      *depth = *depth + 1;
      iVar4 = iVar4 + 1;
      pIVar1 = pIVar5->m_pidNext;
    } while (pIVar5->m_pidNext != (Ident *)0x0);
  }
  if (pBucketCount != (int32 *)0x0) {
    *pBucketCount = iVar4;
  }
  if (pppInsert != (IdentPtr **)0x0) {
    *pppInsert = &pIVar5->m_pidNext;
  }
  return (IdentPtr)0x0;
}

Assistant:

IdentPtr HashTbl::FindExistingPid(
    CharType const * prgch,
    CharType const * end,
    int32 cch,
    uint32 luHash,
    IdentPtr **pppInsert,
    int32 *pBucketCount
#if PROFILE_DICTIONARY
    , int& depth
#endif
    )
{
    int32 bucketCount;
    IdentPtr pid;

    /* Search the hash table for an existing match */
    IdentPtr *ppid = &m_prgpidName[luHash & m_luMask];
    for (bucketCount = 0; nullptr != (pid = *ppid); ppid = &pid->m_pidNext, bucketCount++)
    {
        if (pid->m_luHash == luHash && (int)pid->m_cch == cch &&
            HashTbl::CharsAreEqual(pid->m_sz, prgch, end))
        {
            return pid;
        }
#if PROFILE_DICTIONARY
        ++depth;
#endif
    }

    if (pBucketCount)
    {
        *pBucketCount = bucketCount;
    }
    if (pppInsert)
    {
        *pppInsert = ppid;
    }

    return nullptr;
}